

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

void crnlib::pack_etc1_block_init(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint err;
  int v;
  uint packed_c;
  uint best_packed_c;
  uint best_error;
  int color;
  uint inverse_table_index;
  uint selector;
  uint inten;
  uint limit;
  uint diff;
  
  inten = 0;
  do {
    if (1 < inten) {
      return;
    }
    uVar2 = 0x10;
    if (inten != 0) {
      uVar2 = 0x20;
    }
    for (inverse_table_index = 0; inverse_table_index < 8;
        inverse_table_index = inverse_table_index + 1) {
      for (color = 0; (uint)color < 4; color = color + 1) {
        for (best_packed_c = 0; (int)best_packed_c < 0x100; best_packed_c = best_packed_c + 1) {
          packed_c = 0xffffffff;
          v = 0;
          for (err = 0; err < uVar2; err = err + 1) {
            uVar3 = etc1_decode_value(inten,inverse_table_index,color,err);
            uVar4 = uVar3 - best_packed_c;
            if ((int)uVar4 < 1) {
              uVar4 = -uVar4;
            }
            iVar1 = v;
            if (uVar4 < packed_c) {
              v = err;
              iVar1 = v;
              v._0_2_ = (ushort)err;
              packed_c = uVar4;
              if (uVar4 == 0) break;
            }
            v = iVar1;
          }
          *(ushort *)
           (g_etc1_inverse_lookup +
           (long)(int)best_packed_c * 2 +
           (ulong)(inten + inverse_table_index * 2 + color * 0x10) * 0x200) =
               (ushort)v | (ushort)(packed_c << 8);
        }
      }
    }
    inten = inten + 1;
  } while( true );
}

Assistant:

void pack_etc1_block_init()
    {
        for (uint diff = 0; diff < 2; diff++)
        {
            const uint limit = diff ? 32 : 16;

            for (uint inten = 0; inten < 8; inten++)
            {
                for (uint selector = 0; selector < 4; selector++)
                {
                    const uint inverse_table_index = diff + (inten << 1) + (selector << 4);
                    for (int color = 0; color < 256; color++)
                    {
                        uint best_error = cUINT32_MAX, best_packed_c = 0;
                        for (uint packed_c = 0; packed_c < limit; packed_c++)
                        {
                            int v = etc1_decode_value(diff, inten, selector, packed_c);
                            uint err = labs(v - color);
                            if (err < best_error)
                            {
                                best_error = err;
                                best_packed_c = packed_c;
                                if (!best_error)
                                {
                                    break;
                                }
                            }
                        }
                        CRNLIB_ASSERT(best_error <= 255);
                        g_etc1_inverse_lookup[inverse_table_index][color] = static_cast<uint16>(best_packed_c | (best_error << 8));
                    }
                }
            }
        }
    }